

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ostream *poVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int in_R8D;
  vector<unsigned_long,_std::allocator<unsigned_long>_> arrow_point;
  arrows_position arrows_found;
  Mat image_test;
  Mat image_test_gray;
  array<cv::RotatedRect,_10UL> target_ellipses;
  array<cv::Mat,_10UL> target_ring_mask;
  allocator_type local_5b1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_5b0;
  void *local_598;
  undefined8 uStack_590;
  long local_588;
  void *pvStack_580;
  undefined8 local_578;
  long lStack_570;
  Mat local_568 [8];
  int local_560;
  int local_55c;
  long local_558;
  Mat local_508 [96];
  undefined1 local_4a8 [200];
  undefined1 local_3e0 [16];
  long local_3d0 [118];
  
  local_3e0._0_8_ = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Surrog[P]ArcheryCounter/Images/\\20190325_204137.jpg"
             ,"");
  cv::imread((string *)local_568,(int)local_3e0);
  if ((long *)local_3e0._0_8_ != local_3d0) {
    operator_delete((void *)local_3e0._0_8_,local_3d0[0] + 1);
  }
  if (local_558 == 0) {
    puts("No image data");
    iVar2 = -1;
  }
  else {
    cv::Mat::Mat(local_508);
    local_3d0[0] = 0;
    local_3e0._0_4_ = 2.3693558e-38;
    local_4a8._16_4_ = 0;
    local_4a8._20_4_ = 0;
    local_4a8._0_4_ = 9.477423e-38;
    local_4a8._8_8_ = local_508;
    local_3e0._8_8_ = local_568;
    cv::cvtColor((cv *)local_3e0,(_InputArray *)local_4a8,(_OutputArray *)0x6,0,in_R8D);
    ellipses::find_target((array<cv::RotatedRect,_10UL> *)local_4a8,local_568,false);
    compute_target_ring_mask
              ((array<cv::Mat,_10UL> *)local_3e0,(array<cv::RotatedRect,_10UL> *)local_4a8,local_560
               ,local_55c,false);
    local_578 = 0;
    lStack_570 = 0;
    local_588 = 0;
    pvStack_580 = (void *)0x0;
    local_598 = (void *)0x0;
    uStack_590 = 0;
    ellipses::display_ellipses<cv::RotatedRect*>
              (local_568,(RotatedRect *)local_4a8,(RotatedRect *)local_3e0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_5b0,0,&local_5b1);
    if (local_5b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_5b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar3 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"arrow ",6);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        local_5b1 = (allocator_type)0xa;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_5b1,1);
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)((long)local_5b0.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_5b0.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (local_5b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_5b0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_5b0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      if (pvStack_580 != (void *)0x0) {
        operator_delete(pvStack_580,lStack_570 - (long)pvStack_580);
      }
    }
    if (local_598 != (void *)0x0) {
      operator_delete(local_598,local_588 - (long)local_598);
    }
    lVar4 = 0x360;
    do {
      cv::Mat::~Mat((Mat *)(local_3e0 + lVar4));
      lVar4 = lVar4 + -0x60;
    } while (lVar4 != -0x60);
    cv::Mat::~Mat(local_508);
    iVar2 = 0;
  }
  cv::Mat::~Mat(local_568);
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
    cv::Mat image_test = cv::imread(test, cv::IMREAD_COLOR);

    if(!image_test.data)
    {
        printf("No image data\n");
        return -1;
    }

    cv::Mat image_test_gray;
    cv::cvtColor(image_test, image_test_gray, cv::COLOR_BGR2GRAY);

    std::array<cv::RotatedRect, 10> target_ellipses = ellipses::find_target(image_test, false);

    std::array<cv::Mat, 10> target_ring_mask
        = compute_target_ring_mask(target_ellipses, image_test.rows, image_test.cols);

    auto arrows_found = NN::find_arrows(image_test, image_test_gray, target_ring_mask);

    ellipses::display_ellipses(image_test, target_ellipses.begin(), target_ellipses.end());

    assert(arrows_found.tip.size() == arrows_found.fletching.size());

    std::vector<std::size_t> arrow_point(arrows_found.tip.size());
    std::transform(arrows_found.tip.begin(), arrows_found.tip.end(), arrow_point.begin(),
        [&target_ring_mask](const cv::Point& tip_pos) { return get_arrow_point(tip_pos, target_ring_mask); });

	for(std::size_t i = 0; i < arrow_point.size();                                                                       i++)
    {
        std::cout << "arrow " << i << arrow_point[i] << '\n';
    }

    return 0;
}